

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O2

Vector<int,_4> __thiscall
deqp::gles3::Functional::swizzleVec<int>(Functional *this,Vector<int,_4> *vec,int swzNdx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Vector<int,_4> VVar5;
  
  lVar4 = (long)(swzNdx % 8) * 0x10;
  iVar1 = vec->m_data[*(int *)(s_swizzles + lVar4 + 4)];
  iVar2 = vec->m_data[*(int *)(s_swizzles + lVar4 + 8)];
  iVar3 = vec->m_data[*(int *)(s_swizzles + lVar4 + 0xc)];
  *(int *)this = vec->m_data[*(int *)(s_swizzles + lVar4)];
  *(int *)(this + 4) = iVar1;
  *(int *)(this + 8) = iVar2;
  *(int *)(this + 0xc) = iVar3;
  VVar5.m_data[2] = iVar1;
  VVar5.m_data._0_8_ = this;
  VVar5.m_data[3] = 0;
  return (Vector<int,_4>)VVar5.m_data;
}

Assistant:

inline tcu::Vector<T, 4> swizzleVec (const tcu::Vector<T, 4>& vec, int swzNdx)
{
	const IVec4& swz = s_swizzles[swzNdx % DE_LENGTH_OF_ARRAY(s_swizzles)];
	return vec.swizzle(swz[0], swz[1], swz[2], swz[3]);
}